

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> __thiscall
google::protobuf::internal::ExtensionSet::Insert(ExtensionSet *this,int key)

{
  int *__src;
  ushort uVar1;
  int iVar2;
  KeyValue *pKVar3;
  char cVar4;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  Extension *pEVar6;
  Extension *pEVar7;
  long lVar8;
  size_t __n;
  size_t extraout_RDX;
  KeyValue *pKVar9;
  ulong uVar10;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar11;
  
  uVar1 = this->flat_size_;
  if ((short)uVar1 < 0) {
LAB_00f87d02:
    pVar11 = InternalInsertIntoLargeMap(this,key);
  }
  else {
    pKVar9 = (this->map_).flat;
    uVar10 = (ulong)uVar1;
    if (uVar1 != 0) {
      pEVar6 = (Extension *)((ulong)uVar1 * 0x20);
      uVar10 = (ulong)uVar1;
      pKVar3 = pKVar9 + uVar1;
      do {
        iVar2 = pKVar3[-1].first;
        cVar4 = (iVar2 < key) * '\x02';
        if (iVar2 == key) {
          cVar4 = '\x01';
        }
        pEVar7 = &pKVar3[-1].second;
        if (iVar2 != key) {
          pEVar7 = pEVar6;
        }
        if (cVar4 != '\0') {
          if (cVar4 != '\x02') {
            pVar5._8_8_ = 0;
            pVar5.first = pEVar7;
            return pVar5;
          }
          goto LAB_00f87c8d;
        }
        uVar10 = uVar10 - 1;
        pEVar6 = pEVar7;
        pKVar3 = pKVar3 + -1;
      } while (uVar10 != 0);
      uVar10 = 0;
    }
LAB_00f87c8d:
    if (uVar1 == this->flat_capacity_) {
      GrowCapacity(this,(ulong)uVar1 + 1);
      if ((short)this->flat_size_ < 0) goto LAB_00f87d02;
      pKVar9 = (this->map_).flat;
    }
    uVar10 = (ulong)(((uint)uVar10 & 0xffff) << 5);
    __src = (int *)((long)(&(pKVar9->second).cached_size + -5) + uVar10);
    lVar8 = (ulong)this->flat_size_ * 0x20;
    __n = lVar8 - uVar10;
    if (__n != 0) {
      memmove((void *)((long)pKVar9 + (lVar8 - __n) + 0x20),__src,__n);
      __n = extraout_RDX;
    }
    this->flat_size_ = this->flat_size_ + 1;
    *__src = key;
    __src[2] = 0;
    __src[3] = 0;
    __src[4] = 0;
    __src[5] = 0;
    __src[6] = 0;
    __src[7] = 0;
    pVar11._9_7_ = (int7)(__n >> 8);
    pVar11.second = true;
    pVar11.first = (Extension *)(__src + 2);
  }
  return pVar11;
}

Assistant:

std::pair<ExtensionSet::Extension*, bool> ExtensionSet::Insert(int key) {
  if (ABSL_PREDICT_FALSE(is_large())) {
    return InternalInsertIntoLargeMap(key);
  }
  uint16_t i = flat_size_;
  KeyValue* flat = map_.flat;
  // Iterating from the back to benefit the case where the keys are inserted in
  // increasing order.
  for (; i > 0; --i) {
    int map_key = flat[i - 1].first;
    if (map_key == key) {
      return {&flat[i - 1].second, false};
    }
    if (map_key < key) {
      break;
    }
  }
  if (flat_size_ == flat_capacity_) {
    GrowCapacity(flat_size_ + 1);
    if (ABSL_PREDICT_FALSE(is_large())) {
      return InternalInsertIntoLargeMap(key);
    }
    flat = map_.flat;  // Reload flat pointer after GrowCapacity.
  }

  std::copy_backward(flat + i, flat + flat_size_, flat + flat_size_ + 1);
  ++flat_size_;
  flat[i].first = key;
  flat[i].second = Extension();
  return {&flat[i].second, true};
}